

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O2

void printPCRelImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_mode cVar2;
  uint uVar3;
  cs_detail *pcVar4;
  char *pcVar5;
  _Bool _Var6;
  MCOperand *op;
  int64_t iVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  
  op = MCInst_getOperand(MI,0);
  _Var6 = MCOperand_isImm(op);
  if (!_Var6) {
    return;
  }
  iVar7 = MCOperand_getImm(op);
  uVar8 = (ulong)MI->flat_insn->size + iVar7 + MI->address;
  cVar2 = MI->csh->mode;
  uVar9 = uVar8 & 0xffffffff;
  if (cVar2 == CS_MODE_64) {
    uVar9 = uVar8;
  }
  uVar3 = MI->Opcode;
  if (cVar2 == CS_MODE_16) {
    if ((uVar3 != 0x169) && (uVar3 != 0x460)) {
      uVar9 = uVar8 & 0xffff;
    }
    if (uVar3 != 0x460) goto LAB_001b26b3;
    if (MI->x86_prefix[2] != 'f') goto LAB_001b26c1;
LAB_001b26c7:
    if (-1 < (long)uVar9) goto LAB_001b26cc;
  }
  else {
LAB_001b26b3:
    if ((uVar3 != 0x45f) && (uVar3 != 0x168)) goto LAB_001b26c7;
LAB_001b26c1:
    uVar9 = uVar9 & 0xffff;
LAB_001b26cc:
    if (uVar9 < 10) {
      pcVar5 = "#%lu";
      goto LAB_001b26e2;
    }
  }
  pcVar5 = "#0x%lx";
LAB_001b26e2:
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),pcVar5 + 1,uVar9);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar4 = MI->flat_insn->detail;
    puVar1 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.op_count * 0x30 + 0x55;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    MI->has_imm = true;
    pcVar4 = MI->flat_insn->detail;
    *(ulong *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.op_count * 0x30 + 0x5d) = uVar9;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printPCRelImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op) + MI->flat_insn->size + MI->address;

		// truncat imm for non-64bit
		if (MI->csh->mode != CS_MODE_64) {
			imm = imm & 0xffffffff;
		}

		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode != X86_JMP_4 && MI->Opcode != X86_CALLpcrel32))
			imm = imm & 0xffff;

		// Hack: X86 16bit with opcode X86_JMP_4
		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode == X86_JMP_4 && MI->x86_prefix[2] != 0x66))
			imm = imm & 0xffff;

		// CALL/JMP rel16 is special
		if (MI->Opcode == X86_CALLpcrel16 || MI->Opcode == X86_JMP_2)
			imm = imm & 0xffff;

		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, imm);
		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
			MI->has_imm = true;
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
			MI->flat_insn->detail->x86.op_count++;
		}
	}
}